

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# porting.c
# Opt level: O0

IceTInt icetTypeWidth(IceTEnum type)

{
  IceTInt local_c;
  IceTEnum type_local;
  
  if (type == 0) {
    local_c = 0;
  }
  else if (type == 0x8000) {
    local_c = 1;
  }
  else if (type == 0x8001) {
    local_c = 1;
  }
  else if (type == 0x8002) {
    local_c = 2;
  }
  else if (type == 0x8003) {
    local_c = 4;
  }
  else if (type == 0x8004) {
    local_c = 4;
  }
  else if (type == 0x8005) {
    local_c = 8;
  }
  else if (type == 0x8008) {
    local_c = 8;
  }
  else if (type == 0x800f) {
    local_c = 1;
  }
  else {
    icetRaiseDiagnostic("Bad type identifier.",0xfffffffa,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/porting.c"
                        ,0x4f);
    local_c = 0;
  }
  return local_c;
}

Assistant:

IceTInt icetTypeWidth(IceTEnum type)
{
    switch (type) {
      case ICET_BOOLEAN:
          return sizeof(IceTBoolean);
      case ICET_BYTE:
          return sizeof(IceTByte);
      case ICET_SHORT:
          return sizeof(IceTShort);
      case ICET_INT:
          return sizeof(IceTInt);
      case ICET_FLOAT:
          return sizeof(IceTFloat);
      case ICET_DOUBLE:
          return sizeof(IceTDouble);
      case ICET_POINTER:
          return sizeof(IceTVoid *);
      case ICET_VOID:
          return 1;
      case ICET_NULL:
          return 0;
      default:
          icetRaiseError("Bad type identifier.", ICET_INVALID_VALUE);
    }

    return 0;
}